

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O1

void Logger::queueError<Identifier,unsigned_long,unsigned_long>
               (ErrorType type,char *text,Identifier *args,unsigned_long *args_1,
               unsigned_long *args_2)

{
  unsigned_long *in_R9;
  string_view text_00;
  string message;
  string local_30;
  
  tinyformat::format<Identifier,unsigned_long,unsigned_long>
            (&local_30,(tinyformat *)text,(char *)args,(Identifier *)args_1,args_2,in_R9);
  text_00._M_str = (char *)args_1;
  text_00._M_len = (size_t)local_30._M_dataplus._M_p;
  queueError((Logger *)(ulong)type,(ErrorType)local_30._M_string_length,text_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}